

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beamsplitter.cpp
# Opt level: O1

void beamsplitter_64(void *key,int len,uint seed,void *out)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  long lVar4;
  bool bVar5;
  byte bVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  ulong *puVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  ulong *puVar23;
  uint64_t *puVar24;
  ulong uVar25;
  int iVar26;
  byte bVar27;
  ulong uVar28;
  long lVar29;
  int Len;
  
  puVar1 = state;
  *state = 0x123456789abcdef0;
  puVar1[1] = 0xfedcba987654321;
  puVar1[2] = 0xaccadacca80081e5;
  puVar1[3] = 0xf00baaf00f00baaa;
  uVar8 = len >> 3;
  uVar25 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar17 = 0;
  }
  else {
    iVar26 = 0;
    lVar29 = 1;
    do {
      uVar17 = *(long *)((long)key + lVar29 * 8 + -8) + lVar29;
      bVar6 = (char)lVar29 + (char)puVar1[iVar26] & 0x3f;
      puVar1[iVar26] = (uVar17 >> bVar6 | uVar17 << 0x40 - bVar6) + puVar1[iVar26];
      puVar13 = puVar1 + 1;
      puVar23 = puVar1;
      if (iVar26 == 1) {
LAB_001705f2:
        uVar17 = *puVar23;
        uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + *puVar13;
        *puVar13 = uVar28;
        *puVar23 = uVar28 ^ uVar17;
        *puVar13 = uVar17;
        *puVar23 = uVar28;
        uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
        if ((uVar28 & 0x3f) == 0) {
          uVar16 = uVar17;
        }
        *puVar13 = uVar16;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar13 = puVar1 + 3;
        puVar23 = puVar1 + 2;
        goto LAB_001705f2;
      }
      iVar26 = iVar26 + 1;
      lVar4 = (1 - uVar25) + lVar29;
      lVar29 = lVar29 + 1;
    } while (lVar4 != 1);
    uVar17 = (ulong)((int)lVar29 - 1);
  }
  uVar16 = *puVar1;
  uVar12 = T[(uint)uVar16 & 0x3ff] + uVar16 + puVar1[1];
  *puVar1 = uVar12;
  uVar28 = uVar16 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar16 >> (uVar12 & 0x3f);
  if ((uVar12 & 0x3f) == 0) {
    uVar28 = uVar16;
  }
  puVar1[1] = uVar28;
  uVar14 = (int)uVar17 * 8;
  if ((int)uVar14 < len) {
    uVar20 = uVar14 & 0x18;
    lVar29 = 0;
    uVar15 = uVar14;
    do {
      cVar7 = (char)uVar17 * '\b' + '\x01' + (char)lVar29;
      bVar27 = *(char *)((long)key + lVar29 + uVar17 * 8) + cVar7;
      bVar6 = state8[(int)uVar20];
      bVar10 = cVar7 + bVar6 & 7;
      bVar10 = bVar27 >> bVar10 | bVar27 << 8 - bVar10;
      if ((bVar6 + 1 + (int)lVar29 & 7) == 0) {
        bVar10 = bVar27;
      }
      state8[(int)uVar20] = bVar10 + bVar6;
      puVar1 = state;
      uVar12 = (ulong)(uVar14 + (uVar15 / 3) * -3 + (int)lVar29);
      uVar16 = state[uVar12];
      uVar19 = T[(uint)uVar16 & 0x3ff] + uVar16 + state[uVar12 + 1];
      state[uVar12] = uVar19;
      uVar28 = uVar16 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar16 >> (uVar19 & 0x3f);
      if ((uVar19 & 0x3f) == 0) {
        uVar28 = uVar16;
      }
      puVar1[uVar12 + 1] = uVar28;
      bVar5 = 0x1e < (int)uVar20;
      uVar20 = uVar20 + 1;
      if (bVar5) {
        uVar20 = 0;
      }
      lVar29 = lVar29 + 1;
      uVar15 = uVar15 + 1;
    } while ((ulong)(uint)len + uVar17 * -8 != lVar29);
  }
  puVar2 = state;
  uVar17 = *state;
  puVar1 = state + 2;
  uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + state[1];
  *state = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  uVar28 = *puVar1 + T[(uint)uVar16 & 0x3ff] + uVar16;
  puVar2[1] = uVar28;
  uVar17 = uVar16 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar16 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar17 = uVar16;
  }
  uVar28 = puVar2[3] + T[(uint)uVar17 & 0x3ff] + uVar17;
  puVar2[2] = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar2[3] = uVar16;
  if ((int)uVar8 < 1) {
    uVar14 = 0;
  }
  else {
    iVar26 = 0;
    lVar29 = 1;
    do {
      uVar17 = *(long *)((long)key + lVar29 * 8 + -8) + lVar29;
      bVar6 = (char)lVar29 + (char)puVar2[iVar26] & 0x3f;
      puVar2[iVar26] = (uVar17 >> bVar6 | uVar17 << 0x40 - bVar6) + puVar2[iVar26];
      puVar13 = puVar2 + 1;
      puVar23 = puVar2;
      if (iVar26 == 1) {
LAB_001708bb:
        uVar17 = *puVar23;
        uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + *puVar13;
        *puVar13 = uVar28;
        *puVar23 = uVar28 ^ uVar17;
        *puVar13 = uVar17;
        *puVar23 = uVar28;
        uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
        if ((uVar28 & 0x3f) == 0) {
          uVar16 = uVar17;
        }
        *puVar13 = uVar16;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar13 = puVar2 + 3;
        puVar23 = puVar2 + 2;
        goto LAB_001708bb;
      }
      iVar26 = iVar26 + 1;
      lVar4 = (1 - uVar25) + lVar29;
      lVar29 = lVar29 + 1;
    } while (lVar4 != 1);
    uVar14 = (int)lVar29 - 1;
  }
  uVar17 = *puVar2;
  uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + puVar2[1];
  *puVar2 = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar2[1] = uVar16;
  uVar15 = uVar14 * 8;
  if ((int)uVar15 < len) {
    uVar21 = uVar15 & 0x18;
    lVar29 = 0;
    uVar20 = uVar15;
    do {
      cVar7 = (char)uVar14 * '\b' + '\x01' + (char)lVar29;
      bVar27 = *(char *)((long)key + lVar29 + (ulong)uVar14 * 8) + cVar7;
      bVar6 = state8[(int)uVar21];
      bVar10 = cVar7 + bVar6 & 7;
      bVar10 = bVar27 >> bVar10 | bVar27 << 8 - bVar10;
      if ((bVar6 + 1 + (int)lVar29 & 7) == 0) {
        bVar10 = bVar27;
      }
      state8[(int)uVar21] = bVar10 + bVar6;
      puVar1 = state;
      uVar28 = (ulong)(uVar15 + (uVar20 / 3) * -3 + (int)lVar29);
      uVar17 = state[uVar28];
      uVar12 = T[(uint)uVar17 & 0x3ff] + uVar17 + state[uVar28 + 1];
      state[uVar28] = uVar12;
      uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar17 >> (uVar12 & 0x3f);
      if ((uVar12 & 0x3f) == 0) {
        uVar16 = uVar17;
      }
      puVar1[uVar28 + 1] = uVar16;
      bVar5 = 0x1e < (int)uVar21;
      uVar21 = uVar21 + 1;
      if (bVar5) {
        uVar21 = 0;
      }
      lVar29 = lVar29 + 1;
      uVar20 = uVar20 + 1;
    } while ((ulong)(uint)len + (ulong)uVar14 * -8 != lVar29);
  }
  puVar2 = state;
  uVar17 = *state;
  puVar1 = state + 2;
  uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + state[1];
  *state = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  uVar28 = *puVar1 + T[(uint)uVar16 & 0x3ff] + uVar16;
  puVar2[1] = uVar28;
  uVar17 = uVar16 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar16 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar17 = uVar16;
  }
  uVar28 = puVar2[3] + T[(uint)uVar17 & 0x3ff] + uVar17;
  puVar2[2] = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar2[3] = uVar16;
  if ((int)uVar8 < 1) {
    uVar14 = 0;
  }
  else {
    iVar26 = 0;
    lVar29 = 1;
    do {
      uVar17 = *(long *)((long)key + lVar29 * 8 + -8) + lVar29;
      bVar6 = (char)lVar29 + (char)puVar2[iVar26] & 0x3f;
      puVar2[iVar26] = (uVar17 >> bVar6 | uVar17 << 0x40 - bVar6) + puVar2[iVar26];
      puVar13 = puVar2 + 1;
      puVar23 = puVar2;
      if (iVar26 == 1) {
LAB_00170b71:
        uVar17 = *puVar23;
        uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + *puVar13;
        *puVar13 = uVar28;
        *puVar23 = uVar28 ^ uVar17;
        *puVar13 = uVar17;
        *puVar23 = uVar28;
        uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
        if ((uVar28 & 0x3f) == 0) {
          uVar16 = uVar17;
        }
        *puVar13 = uVar16;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar13 = puVar2 + 3;
        puVar23 = puVar2 + 2;
        goto LAB_00170b71;
      }
      iVar26 = iVar26 + 1;
      lVar4 = (1 - uVar25) + lVar29;
      lVar29 = lVar29 + 1;
    } while (lVar4 != 1);
    uVar14 = (int)lVar29 - 1;
  }
  uVar17 = *puVar2;
  uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + puVar2[1];
  *puVar2 = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar2[1] = uVar16;
  uVar15 = uVar14 * 8;
  if ((int)uVar15 < len) {
    uVar21 = uVar15 & 0x18;
    lVar29 = 0;
    uVar20 = uVar15;
    do {
      cVar7 = (char)uVar14 * '\b' + '\x01' + (char)lVar29;
      bVar27 = *(char *)((long)key + lVar29 + (ulong)uVar14 * 8) + cVar7;
      bVar6 = state8[(int)uVar21];
      bVar10 = cVar7 + bVar6 & 7;
      bVar10 = bVar27 >> bVar10 | bVar27 << 8 - bVar10;
      if ((bVar6 + 1 + (int)lVar29 & 7) == 0) {
        bVar10 = bVar27;
      }
      state8[(int)uVar21] = bVar10 + bVar6;
      puVar1 = state;
      uVar28 = (ulong)(uVar15 + (uVar20 / 3) * -3 + (int)lVar29);
      uVar17 = state[uVar28];
      uVar12 = T[(uint)uVar17 & 0x3ff] + uVar17 + state[uVar28 + 1];
      state[uVar28] = uVar12;
      uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar17 >> (uVar12 & 0x3f);
      if ((uVar12 & 0x3f) == 0) {
        uVar16 = uVar17;
      }
      puVar1[uVar28 + 1] = uVar16;
      bVar5 = 0x1e < (int)uVar21;
      uVar21 = uVar21 + 1;
      if (bVar5) {
        uVar21 = 0;
      }
      lVar29 = lVar29 + 1;
      uVar20 = uVar20 + 1;
    } while ((ulong)(uint)len + (ulong)uVar14 * -8 != lVar29);
  }
  puVar1 = state;
  uVar17 = *state;
  uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + state[1];
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  uVar12 = state[2] + T[(uint)uVar16 & 0x3ff] + uVar16;
  uVar17 = uVar16 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar16 >> (uVar12 & 0x3f);
  if ((uVar12 & 0x3f) == 0) {
    uVar17 = uVar16;
  }
  uVar19 = state[3] + T[(uint)uVar17 & 0x3ff] + uVar17;
  state[2] = uVar19;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar17 >> (uVar19 & 0x3f);
  if ((uVar19 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar1[3] = uVar16;
  uVar17 = ((ulong)(seed - 2) << 0x20) + 1 + (ulong)(0xc5550690 - seed);
  bVar6 = (byte)uVar28 + 1 & 0x3f;
  uVar28 = (uVar17 >> bVar6 | uVar17 << 0x40 - bVar6) + uVar28;
  uVar12 = T[(uint)uVar28 & 0x3ff] + uVar28 + uVar12;
  *puVar1 = uVar12;
  uVar16 = uVar28 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar28 >> (uVar12 & 0x3f);
  if ((uVar12 & 0x3f) == 0) {
    uVar16 = uVar28;
  }
  puVar1[1] = uVar16;
  puVar1 = state;
  uVar16 = *state;
  uVar12 = T[(uint)uVar16 & 0x3ff] + uVar16 + state[1];
  uVar28 = uVar16 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar16 >> (uVar12 & 0x3f);
  if ((uVar12 & 0x3f) == 0) {
    uVar28 = uVar16;
  }
  uVar19 = state[2] + T[(uint)uVar28 & 0x3ff] + uVar28;
  uVar16 = uVar28 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar28 >> (uVar19 & 0x3f);
  if ((uVar19 & 0x3f) == 0) {
    uVar16 = uVar28;
  }
  uVar18 = state[3] + T[(uint)uVar16 & 0x3ff] + uVar16;
  state[2] = uVar18;
  uVar28 = uVar16 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar16 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar28 = uVar16;
  }
  puVar1[3] = uVar28;
  bVar6 = (byte)uVar12 + 1 & 0x3f;
  uVar12 = (uVar17 >> bVar6 | uVar17 << 0x40 - bVar6) + uVar12;
  uVar19 = T[(uint)uVar12 & 0x3ff] + uVar12 + uVar19;
  *puVar1 = uVar19;
  uVar17 = uVar12 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar12 >> (uVar19 & 0x3f);
  if ((uVar19 & 0x3f) == 0) {
    uVar17 = uVar12;
  }
  puVar1[1] = uVar17;
  puVar2 = state;
  uVar17 = *state;
  puVar1 = state + 2;
  uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + state[1];
  *state = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  uVar28 = *puVar1 + T[(uint)uVar16 & 0x3ff] + uVar16;
  puVar2[1] = uVar28;
  uVar17 = uVar16 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar16 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar17 = uVar16;
  }
  uVar28 = puVar2[3] + T[(uint)uVar17 & 0x3ff] + uVar17;
  puVar2[2] = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar2[3] = uVar16;
  if ((int)uVar8 < 1) {
    uVar17 = 0;
  }
  else {
    iVar26 = 0;
    lVar29 = 1;
    do {
      uVar17 = *(long *)((long)key + lVar29 * 8 + -8) + lVar29;
      bVar6 = (char)lVar29 + (char)puVar2[iVar26] & 0x3f;
      puVar2[iVar26] = (uVar17 >> bVar6 | uVar17 << 0x40 - bVar6) + puVar2[iVar26];
      puVar13 = puVar2 + 1;
      puVar23 = puVar2;
      if (iVar26 == 1) {
LAB_00170fef:
        uVar17 = *puVar23;
        uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + *puVar13;
        *puVar13 = uVar28;
        *puVar23 = uVar28 ^ uVar17;
        *puVar13 = uVar17;
        *puVar23 = uVar28;
        uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
        if ((uVar28 & 0x3f) == 0) {
          uVar16 = uVar17;
        }
        *puVar13 = uVar16;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar13 = puVar2 + 3;
        puVar23 = puVar2 + 2;
        goto LAB_00170fef;
      }
      iVar26 = iVar26 + 1;
      lVar4 = (1 - uVar25) + lVar29;
      lVar29 = lVar29 + 1;
    } while (lVar4 != 1);
    uVar17 = (ulong)((int)lVar29 - 1);
  }
  uVar16 = *puVar2;
  uVar12 = T[(uint)uVar16 & 0x3ff] + uVar16 + puVar2[1];
  *puVar2 = uVar12;
  uVar28 = uVar16 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar16 >> (uVar12 & 0x3f);
  if ((uVar12 & 0x3f) == 0) {
    uVar28 = uVar16;
  }
  puVar2[1] = uVar28;
  uVar14 = (int)uVar17 * 8;
  if ((int)uVar14 < len) {
    uVar20 = uVar14 & 0x18;
    lVar29 = 0;
    uVar15 = uVar14;
    do {
      cVar7 = (char)uVar17 * '\b' + '\x01' + (char)lVar29;
      bVar27 = *(char *)((long)key + lVar29 + uVar17 * 8) + cVar7;
      bVar6 = state8[(int)uVar20];
      bVar10 = cVar7 + bVar6 & 7;
      bVar10 = bVar27 >> bVar10 | bVar27 << 8 - bVar10;
      if ((bVar6 + 1 + (int)lVar29 & 7) == 0) {
        bVar10 = bVar27;
      }
      state8[(int)uVar20] = bVar10 + bVar6;
      puVar1 = state;
      uVar12 = (ulong)(uVar14 + (uVar15 / 3) * -3 + (int)lVar29);
      uVar16 = state[uVar12];
      uVar19 = T[(uint)uVar16 & 0x3ff] + uVar16 + state[uVar12 + 1];
      state[uVar12] = uVar19;
      uVar28 = uVar16 << ((ulong)(byte)-((byte)uVar19 & 0x3f) & 0x3f) | uVar16 >> (uVar19 & 0x3f);
      if ((uVar19 & 0x3f) == 0) {
        uVar28 = uVar16;
      }
      puVar1[uVar12 + 1] = uVar28;
      bVar5 = 0x1e < (int)uVar20;
      uVar20 = uVar20 + 1;
      if (bVar5) {
        uVar20 = 0;
      }
      lVar29 = lVar29 + 1;
      uVar15 = uVar15 + 1;
    } while ((ulong)(uint)len + uVar17 * -8 != lVar29);
  }
  puVar2 = state;
  uVar17 = *state;
  puVar1 = state + 2;
  uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + state[1];
  *state = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  uVar28 = *puVar1 + T[(uint)uVar16 & 0x3ff] + uVar16;
  puVar2[1] = uVar28;
  uVar17 = uVar16 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar16 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar17 = uVar16;
  }
  uVar28 = puVar2[3] + T[(uint)uVar17 & 0x3ff] + uVar17;
  puVar2[2] = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar2[3] = uVar16;
  if ((int)uVar8 < 1) {
    uVar14 = 0;
  }
  else {
    iVar26 = 0;
    lVar29 = 1;
    do {
      uVar17 = *(long *)((long)key + lVar29 * 8 + -8) + lVar29;
      bVar6 = (char)lVar29 + (char)puVar2[iVar26] & 0x3f;
      puVar2[iVar26] = (uVar17 >> bVar6 | uVar17 << 0x40 - bVar6) + puVar2[iVar26];
      puVar13 = puVar2 + 1;
      puVar23 = puVar2;
      if (iVar26 == 1) {
LAB_001712a4:
        uVar17 = *puVar23;
        uVar28 = T[(uint)uVar17 & 0x3ff] + uVar17 + *puVar13;
        *puVar13 = uVar28;
        *puVar23 = uVar28 ^ uVar17;
        *puVar13 = uVar17;
        *puVar23 = uVar28;
        uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
        if ((uVar28 & 0x3f) == 0) {
          uVar16 = uVar17;
        }
        *puVar13 = uVar16;
      }
      else if (iVar26 == 3) {
        iVar26 = -1;
        puVar13 = puVar2 + 3;
        puVar23 = puVar2 + 2;
        goto LAB_001712a4;
      }
      iVar26 = iVar26 + 1;
      lVar4 = (1 - uVar25) + lVar29;
      lVar29 = lVar29 + 1;
    } while (lVar4 != 1);
    uVar14 = (int)lVar29 - 1;
  }
  uVar17 = *puVar2;
  *puVar2 = T[(uint)uVar17 & 0x3ff] + uVar17 + puVar2[1] ^ uVar17;
  puVar2[1] = uVar17;
  puVar1 = state;
  uVar17 = state[1];
  uVar28 = *state ^ uVar17;
  *state = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar1[1] = uVar16;
  uVar15 = uVar14 * 8;
  if ((int)uVar15 < len) {
    uVar21 = uVar15 & 0x18;
    lVar29 = 0;
    uVar20 = uVar15;
    do {
      iVar22 = uVar15 + (uVar20 / 3) * -3;
      iVar26 = (int)lVar29;
      cVar7 = (char)uVar14 * '\b' + '\x01' + (char)lVar29;
      bVar27 = *(char *)((long)key + lVar29 + (ulong)uVar14 * 8) + cVar7;
      bVar6 = state8[(int)uVar21];
      bVar10 = cVar7 + bVar6 & 7;
      bVar10 = bVar27 >> bVar10 | bVar27 << 8 - bVar10;
      if ((bVar6 + 1 + iVar26 & 7) == 0) {
        bVar10 = bVar27;
      }
      state8[(int)uVar21] = bVar10 + bVar6;
      uVar9 = iVar26 + iVar22;
      uVar11 = iVar26 + 1 + iVar22;
      state[uVar11] = state[uVar11] + state[uVar9] + T[(uint)state[uVar9] & 0x3ff];
      state[uVar9] = state[uVar9] ^ state[uVar11];
      state[uVar11] = state[uVar11] ^ state[uVar9];
      state[uVar9] = state[uVar9] ^ state[uVar11];
      uVar17 = state[uVar11];
      uVar16 = state[uVar9];
      uVar28 = uVar17 << ((ulong)(byte)-((byte)uVar16 & 0x3f) & 0x3f) | uVar17 >> (uVar16 & 0x3f);
      if ((uVar16 & 0x3f) == 0) {
        uVar28 = uVar17;
      }
      state[uVar11] = uVar28;
      bVar5 = 0x1e < (int)uVar21;
      uVar21 = uVar21 + 1;
      if (bVar5) {
        uVar21 = 0;
      }
      lVar29 = lVar29 + 1;
      uVar20 = uVar20 + 1;
    } while ((ulong)(uint)len + (ulong)uVar14 * -8 != lVar29);
  }
  state[1] = state[1] + *state + T[(uint)*state & 0x3ff];
  puVar1 = state;
  uVar17 = *state;
  *state = state[1] ^ uVar17;
  puVar1[1] = uVar17;
  puVar1 = state;
  uVar17 = state[1];
  uVar28 = *state ^ uVar17;
  *state = uVar28;
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar28 & 0x3f) & 0x3f) | uVar17 >> (uVar28 & 0x3f);
  if ((uVar28 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  puVar1[1] = uVar16;
  state[2] = state[2] + state[1] + T[(uint)state[1] & 0x3ff];
  state[1] = state[1] ^ state[2];
  state[2] = state[2] ^ state[1];
  state[1] = state[1] ^ state[2];
  uVar17 = state[1];
  uVar16 = state[2];
  uVar28 = uVar16 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar16 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar28 = uVar16;
  }
  state[2] = uVar28;
  state[3] = state[3] + state[2] + T[(uint)state[2] & 0x3ff];
  state[2] = state[2] ^ state[3];
  state[3] = state[3] ^ state[2];
  state[2] = state[2] ^ state[3];
  uVar17 = state[2];
  uVar16 = state[3];
  uVar28 = uVar16 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar16 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar28 = uVar16;
  }
  state[3] = uVar28;
  puVar1 = state;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  else {
    puVar2 = state + 3;
    puVar3 = state + 1;
    iVar26 = 0;
    lVar29 = 1;
    do {
      uVar17 = *(long *)((long)key + lVar29 * 8 + -8) + lVar29;
      bVar6 = (char)lVar29 + (char)puVar1[iVar26] & 0x3f;
      puVar1[iVar26] = (uVar17 >> bVar6 | uVar17 << 0x40 - bVar6) + puVar1[iVar26];
      if (iVar26 == 3) {
        uVar17 = puVar1[2];
        uVar16 = T[(uint)uVar17 & 0x3ff] + uVar17 + puVar1[3];
        puVar1[3] = uVar17;
        puVar1[2] = uVar16;
        iVar26 = -1;
        puVar24 = puVar2;
LAB_0017168f:
        uVar28 = uVar17 << ((ulong)(byte)-((byte)uVar16 & 0x3f) & 0x3f) | uVar17 >> (uVar16 & 0x3f);
        if ((uVar16 & 0x3f) == 0) {
          uVar28 = uVar17;
        }
        *puVar24 = uVar28;
      }
      else if (iVar26 == 1) {
        uVar17 = *puVar1;
        *puVar1 = T[(uint)uVar17 & 0x3ff] + uVar17 + puVar1[1] ^ uVar17;
        puVar1[1] = uVar17;
        uVar17 = puVar1[1];
        uVar16 = *puVar1 ^ uVar17;
        *puVar1 = uVar16;
        iVar26 = 1;
        puVar24 = puVar3;
        goto LAB_0017168f;
      }
      iVar26 = iVar26 + 1;
      lVar4 = (1 - uVar25) + lVar29;
      lVar29 = lVar29 + 1;
    } while (lVar4 != 1);
    uVar8 = (int)lVar29 - 1;
  }
  state[1] = state[1] + *state + T[(uint)*state & 0x3ff];
  puVar1 = state;
  uVar25 = *state;
  *state = state[1] ^ uVar25;
  puVar1[1] = uVar25;
  puVar1 = state;
  uVar25 = state[1];
  uVar16 = *state ^ uVar25;
  *state = uVar16;
  uVar17 = uVar25 << ((ulong)(byte)-((byte)uVar16 & 0x3f) & 0x3f) | uVar25 >> (uVar16 & 0x3f);
  if ((uVar16 & 0x3f) == 0) {
    uVar17 = uVar25;
  }
  puVar1[1] = uVar17;
  uVar14 = uVar8 * 8;
  if ((int)uVar14 < len) {
    uVar20 = uVar14 & 0x18;
    lVar29 = 0;
    uVar15 = uVar14;
    do {
      iVar22 = uVar14 + (uVar15 / 3) * -3;
      iVar26 = (int)lVar29;
      cVar7 = (char)uVar8 * '\b' + '\x01' + (char)lVar29;
      bVar27 = *(char *)((long)key + lVar29 + (ulong)uVar8 * 8) + cVar7;
      bVar6 = state8[(int)uVar20];
      bVar10 = cVar7 + bVar6 & 7;
      bVar10 = bVar27 >> bVar10 | bVar27 << 8 - bVar10;
      if ((bVar6 + 1 + iVar26 & 7) == 0) {
        bVar10 = bVar27;
      }
      state8[(int)uVar20] = bVar10 + bVar6;
      uVar21 = iVar26 + iVar22;
      uVar9 = iVar26 + 1 + iVar22;
      state[uVar9] = state[uVar9] + state[uVar21] + T[(uint)state[uVar21] & 0x3ff];
      state[uVar21] = state[uVar21] ^ state[uVar9];
      state[uVar9] = state[uVar9] ^ state[uVar21];
      state[uVar21] = state[uVar21] ^ state[uVar9];
      uVar25 = state[uVar9];
      uVar17 = state[uVar21];
      uVar16 = uVar25 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar25 >> (uVar17 & 0x3f);
      if ((uVar17 & 0x3f) == 0) {
        uVar16 = uVar25;
      }
      state[uVar9] = uVar16;
      bVar5 = 0x1e < (int)uVar20;
      uVar20 = uVar20 + 1;
      if (bVar5) {
        uVar20 = 0;
      }
      lVar29 = lVar29 + 1;
      uVar15 = uVar15 + 1;
    } while ((ulong)(uint)len + (ulong)uVar8 * -8 != lVar29);
  }
  state[1] = state[1] + *state + T[(uint)*state & 0x3ff];
  puVar1 = state;
  uVar25 = *state;
  *state = state[1] ^ uVar25;
  puVar1[1] = uVar25;
  puVar1 = state;
  uVar25 = state[1];
  uVar16 = *state ^ uVar25;
  *state = uVar16;
  uVar17 = uVar25 << ((ulong)(byte)-((byte)uVar16 & 0x3f) & 0x3f) | uVar25 >> (uVar16 & 0x3f);
  if ((uVar16 & 0x3f) == 0) {
    uVar17 = uVar25;
  }
  puVar1[1] = uVar17;
  state[2] = state[2] + state[1] + T[(uint)state[1] & 0x3ff];
  state[1] = state[1] ^ state[2];
  state[2] = state[2] ^ state[1];
  state[1] = state[1] ^ state[2];
  uVar25 = state[1];
  uVar17 = state[2];
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar25 & 0x3f) & 0x3f) | uVar17 >> (uVar25 & 0x3f);
  if ((uVar25 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  state[2] = uVar16;
  state[3] = state[3] + state[2] + T[(uint)state[2] & 0x3ff];
  state[2] = state[2] ^ state[3];
  state[3] = state[3] ^ state[2];
  state[2] = state[2] ^ state[3];
  uVar25 = state[2];
  uVar17 = state[3];
  uVar16 = uVar17 << ((ulong)(byte)-((byte)uVar25 & 0x3f) & 0x3f) | uVar17 >> (uVar25 & 0x3f);
  if ((uVar25 & 0x3f) == 0) {
    uVar16 = uVar17;
  }
  state[3] = uVar16;
  *(uint64_t *)out = state[3] + state[2];
  return;
}

Assistant:

void beamsplitter_64 ( const void * key, int len, unsigned seed, void * out )
    {
      const uint8_t *key8Arr = (uint8_t *)key;
      const uint64_t *key64Arr = (uint64_t *)key;

      uint8_t seedbuf[8] = {0};
      uint8_t *seed8Arr = (uint8_t *)seedbuf;
      uint64_t *seed64Arr = (uint64_t *)seedbuf;
      uint32_t *seed32Arr = (uint32_t *)seedbuf;

      // the cali number from the Matrix (1999)
      seed32Arr[0] = 0xc5550690;
      seed32Arr[0] -= seed;
      seed32Arr[1] = ~(1 - seed);

      // nothing up my sleeve
      state[0] = 0x123456789abcdef0;
      state[1] = 0x0fedcba987654321;
      state[2] = 0xaccadacca80081e5;
      state[3] = 0xf00baaf00f00baaa;

      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( seed64Arr, seed8Arr, 8 );
      //round( state, state8, STATE   );
      round( seed64Arr, seed8Arr, 8 );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );

      /*
      //printf("state = %#018" PRIx64 " %#018" PRIx64 " %#018" PRIx64 " %#018" PRIx64 "\n",
      //  state[0], state[1], state[2], state[3] );
      */

      //printf("state = %#018" PRIx64 " %#018" PRIx64 "\n",
      //  state[0], state[1] );

      uint8_t output[STATE] = {0};
      uint64_t *h = (uint64_t *)output;

      // The new combination step
      h[0] = state[2];
      h[1] = state[3];

      h[0] += h[1];

      ((uint64_t *)out)[0] = h[0];
    }